

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O0

void __thiscall TextReader::read_token(TextReader *this,char *value)

{
  char *pcVar1;
  bool bVar2;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [55];
  allocator local_79;
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  char *local_18;
  char *value_local;
  TextReader *this_local;
  
  local_18 = value;
  value_local = (char *)this;
  bVar2 = is_token(this,value);
  if (bVar2) {
    skip_token(this);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Expect \"",&local_79);
    pcVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar1,&local_b1);
    std::operator+(local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"\" token",&local_d9);
    std::operator+(local_38,local_58);
    parse_error(this,local_38);
    std::__cxx11::string::~string((string *)local_38);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  return;
}

Assistant:

inline void read_token(const char* value) {
        if (is_token(value))
            skip_token();
        else
            parse_error(std::string("Expect \"") + std::string(value) + std::string("\" token"));
    }